

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O3

void __thiscall
cbtAlignedObjectArray<cbtVector3>::resize
          (cbtAlignedObjectArray<cbtVector3> *this,int newsize,cbtVector3 *fillData)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  undefined8 uVar4;
  uint uVar5;
  cbtVector3 *pcVar6;
  long lVar7;
  long lVar8;
  
  uVar3 = this->m_size;
  if (((int)uVar3 <= newsize) && ((int)uVar3 < newsize)) {
    if (this->m_capacity < newsize) {
      if (newsize == 0) {
        pcVar6 = (cbtVector3 *)0x0;
        uVar5 = uVar3;
      }
      else {
        pcVar6 = (cbtVector3 *)cbtAlignedAllocInternal((long)newsize << 4,0x10);
        uVar5 = this->m_size;
      }
      if (0 < (int)uVar5) {
        lVar7 = 0;
        do {
          puVar1 = (undefined8 *)((long)this->m_data->m_floats + lVar7);
          uVar4 = puVar1[1];
          puVar2 = (undefined8 *)((long)pcVar6->m_floats + lVar7);
          *puVar2 = *puVar1;
          puVar2[1] = uVar4;
          lVar7 = lVar7 + 0x10;
        } while ((ulong)uVar5 << 4 != lVar7);
      }
      if ((this->m_data != (cbtVector3 *)0x0) && (this->m_ownsMemory == true)) {
        cbtAlignedFreeInternal(this->m_data);
      }
      this->m_ownsMemory = true;
      this->m_data = pcVar6;
      this->m_capacity = newsize;
      if (newsize <= (int)uVar3) goto LAB_008bf033;
    }
    lVar8 = (long)newsize - (long)(int)uVar3;
    lVar7 = (long)(int)uVar3 << 4;
    do {
      uVar4 = *(undefined8 *)(fillData->m_floats + 2);
      puVar1 = (undefined8 *)((long)this->m_data->m_floats + lVar7);
      *puVar1 = *(undefined8 *)fillData->m_floats;
      puVar1[1] = uVar4;
      lVar7 = lVar7 + 0x10;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
LAB_008bf033:
  this->m_size = newsize;
  return;
}

Assistant:

SIMD_FORCE_INLINE void resize(int newsize, const T& fillData = T())
	{
		const int curSize = size();

		if (newsize < curSize)
		{
			for (int i = newsize; i < curSize; i++)
			{
				m_data[i].~T();
			}
		}
		else
		{
			if (newsize > curSize)
			{
				reserve(newsize);
			}
#ifdef BT_USE_PLACEMENT_NEW
			for (int i = curSize; i < newsize; i++)
			{
				new (&m_data[i]) T(fillData);
			}
#endif  //BT_USE_PLACEMENT_NEW
		}

		m_size = newsize;
	}